

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

Vec_Vec_t * Saig_ManBmcSections(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  int local_3c;
  int i;
  Aig_Obj_t *pObjPo;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vCone;
  Vec_Ptr_t *vRoots;
  Vec_Ptr_t *vSects;
  Aig_Man_t *p_local;
  
  Aig_ManIncrementTravId(p);
  pAVar2 = Aig_ManConst1(p);
  Aig_ObjSetTravIdCurrent(p,pAVar2);
  p_00 = Vec_PtrAlloc(1000);
  for (local_3c = 0; iVar1 = Saig_ManPoNum(p), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_3c);
    Aig_ObjSetTravIdCurrent(p,pAVar2);
    Vec_PtrPush(p_00,pAVar2);
  }
  p_01 = Vec_PtrAlloc(0x14);
  while (iVar1 = Vec_PtrSize(p_00), 0 < iVar1) {
    p_02 = Saig_ManBmcDfsNodes(p,p_00);
    Vec_PtrPush(p_01,p_02);
    Vec_PtrClear(p_00);
    for (local_3c = 0; iVar1 = Vec_PtrSize(p_02), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_02,local_3c);
      iVar1 = Saig_ObjIsLo(p,pAVar2);
      if (iVar1 != 0) {
        pAVar2 = Saig_ObjLoToLi(p,pAVar2);
        iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar2);
        if (iVar1 == 0) {
          Aig_ObjSetTravIdCurrent(p,pAVar2);
          Vec_PtrPush(p_00,pAVar2);
        }
      }
    }
  }
  Vec_PtrFree(p_00);
  return (Vec_Vec_t *)p_01;
}

Assistant:

Vec_Vec_t * Saig_ManBmcSections( Aig_Man_t * p )
{
    Vec_Ptr_t * vSects, * vRoots, * vCone;
    Aig_Obj_t * pObj, * pObjPo;
    int i;
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    // start the roots
    vRoots = Vec_PtrAlloc( 1000 );
    Saig_ManForEachPo( p, pObjPo, i )
    {
        Aig_ObjSetTravIdCurrent( p, pObjPo );
        Vec_PtrPush( vRoots, pObjPo );
    }
    // compute the cones
    vSects = Vec_PtrAlloc( 20 );
    while ( Vec_PtrSize(vRoots) > 0 )
    {
        vCone = Saig_ManBmcDfsNodes( p, vRoots );
        Vec_PtrPush( vSects, vCone );
        // get the next set of roots
        Vec_PtrClear( vRoots );
        Vec_PtrForEachEntry( Aig_Obj_t *, vCone, pObj, i )
        {
            if ( !Saig_ObjIsLo(p, pObj) )
                continue;
            pObjPo = Saig_ObjLoToLi( p, pObj );
            if ( Aig_ObjIsTravIdCurrent(p, pObjPo) )
                continue;
            Aig_ObjSetTravIdCurrent( p, pObjPo );
            Vec_PtrPush( vRoots, pObjPo );
        }
    }
    Vec_PtrFree( vRoots );
    return (Vec_Vec_t *)vSects;
}